

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowAggFinal(WindowCodeArg *p,int bFin)

{
  int *piVar1;
  KeyInfo *pKVar2;
  long lVar3;
  ExprList *pList;
  Vdbe *p_00;
  int iVar4;
  Op *pOVar5;
  int in_EDX;
  undefined4 in_register_00000034;
  
  p_00 = sqlite3GetVdbe((Parse *)p);
  for (lVar3 = CONCAT44(in_register_00000034,bFin); lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x40)) {
    if (((*(int *)(CONCAT44(in_register_00000034,bFin) + 0x84) == 0) &&
        ((*(byte *)(*(long *)(lVar3 + 0x50) + 5) & 0x10) != 0)) && (*(char *)(lVar3 + 0x21) != 'Z'))
    {
      sqlite3VdbeAddOp3(p_00,0x4b,0,*(int *)(lVar3 + 0x60),0);
      sqlite3VdbeAddOp3(p_00,0x20,*(int *)(lVar3 + 100),0,0);
      sqlite3VdbeAddOp3(p_00,0x5e,*(int *)(lVar3 + 100),0,*(int *)(lVar3 + 0x60));
      pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (p_00->db->mallocFailed == '\0') {
        pOVar5 = p_00->aOp + (long)p_00->nOp + -2;
      }
      pOVar5->p2 = p_00->nOp;
    }
    else if (*(int *)(lVar3 + 0x68) == 0) {
      piVar1 = *(int **)(*(long *)(lVar3 + 0x70) + 0x20);
      if (piVar1 == (int *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *piVar1;
      }
      if (in_EDX == 0) {
        sqlite3VdbeAddOp3(p_00,0xa4,*(int *)(lVar3 + 0x5c),iVar4,*(int *)(lVar3 + 0x60));
        pKVar2 = *(KeyInfo **)(lVar3 + 0x50);
        if (p_00->db->mallocFailed == '\0') {
          pOVar5 = p_00->aOp;
          iVar4 = p_00->nOp;
          pOVar5[(long)iVar4 + -1].p4type = -7;
          pOVar5[(long)iVar4 + -1].p4.pKeyInfo = pKVar2;
        }
        else if ((pKVar2->enc & 0x10) != 0) {
          sqlite3DbNNFreeNN(p_00->db,pKVar2);
        }
      }
      else {
        sqlite3VdbeAddOp3(p_00,0xa5,*(int *)(lVar3 + 0x5c),iVar4,0);
        pKVar2 = *(KeyInfo **)(lVar3 + 0x50);
        if (p_00->db->mallocFailed == '\0') {
          pOVar5 = p_00->aOp;
          iVar4 = p_00->nOp;
          pOVar5[(long)iVar4 + -1].p4type = -7;
          pOVar5[(long)iVar4 + -1].p4.pKeyInfo = pKVar2;
        }
        else if ((pKVar2->enc & 0x10) != 0) {
          sqlite3DbNNFreeNN(p_00->db,pKVar2);
        }
        sqlite3VdbeAddOp3(p_00,0x50,*(int *)(lVar3 + 0x5c),*(int *)(lVar3 + 0x60),0);
        sqlite3VdbeAddOp3(p_00,0x4b,0,*(int *)(lVar3 + 0x5c),0);
      }
    }
  }
  return;
}

Assistant:

static void windowAggFinal(WindowCodeArg *p, int bFin){
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( pMWin->regStartRowid==0
     && (pWin->pWFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
    }else if( pWin->regApp ){
      assert( pMWin->regStartRowid==0 );
    }else{
      int nArg = windowArgCount(pWin);
      if( bFin ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, nArg);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue,pWin->regAccum,nArg,pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
      }
    }
  }
}